

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O1

void __thiscall
Typelib::MemoryLayout::pushMemcpy
          (MemoryLayout *this,size_t size,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *init_data)

{
  iterator iVar1;
  pointer puVar2;
  pointer puVar3;
  runtime_error *this_00;
  unsigned_long local_20 [2];
  
  local_20[1] = 0;
  iVar1._M_current =
       (this->ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_20[0] = size;
  if (iVar1._M_current ==
      (this->ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->ops,iVar1,local_20 + 1);
  }
  else {
    *iVar1._M_current = 0;
    (this->ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar1,local_20);
  }
  else {
    *iVar1._M_current = local_20[0];
    (this->ops).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  puVar2 = (init_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (init_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    pushInitGenericOp(this,3,local_20[0]);
  }
  else {
    if (local_20[0] != (long)puVar3 - (long)puVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"not enough or too many bytes provided as initialization data");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pushInit(this,init_data);
  }
  return;
}

Assistant:

void MemoryLayout::pushMemcpy(size_t size, vector<uint8_t> const& init_data)
{
    ops.push_back(FLAG_MEMCPY);
    ops.push_back(size);

    if (init_data.empty()) {
        pushInitSkip(size);
    }
    else
    {
        if (size != init_data.size()) {
            throw runtime_error(
                "not enough or too many bytes provided as initialization data"
            );
        }
        pushInit(init_data);
    }
}